

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O0

void __thiscall ItemTable::BlueRoomOne(ItemTable *this)

{
  ItemWrapper *pIVar1;
  ItemWrapper *pIVar2;
  mapped_type *ppIVar3;
  key_type local_d4 [2];
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  Item local_a8;
  ItemWrapper *local_80;
  ItemWrapper *Stairs;
  allocator local_61;
  string local_60 [32];
  Item local_40;
  ItemWrapper *local_18;
  ItemWrapper *Torch;
  ItemTable *this_local;
  
  Torch = (ItemWrapper *)this;
  pIVar2 = (ItemWrapper *)operator_new(0x58);
  Stairs._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"A Torch",&local_61);
  Item::Item(&local_40,(string *)local_60,TORCH);
  ItemWrapper::ItemWrapper(pIVar2,&local_40,HIDDEN);
  Stairs._3_1_ = 0;
  Item::~Item(&local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_18 = pIVar2;
  pIVar2 = (ItemWrapper *)operator_new(0x58);
  local_ca = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"Stairs",&local_c9);
  Item::Item(&local_a8,(string *)local_c8,STAIRS);
  ItemWrapper::ItemWrapper(pIVar2,&local_a8,HIDDEN);
  local_ca = 0;
  Item::~Item(&local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  pIVar1 = local_18;
  local_d4[1] = 0x1e;
  local_80 = pIVar2;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_d4 + 1);
  pIVar2 = local_80;
  *ppIVar3 = pIVar1;
  local_d4[0] = STAIRS;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,local_d4);
  *ppIVar3 = pIVar2;
  return;
}

Assistant:

void ItemTable::BlueRoomOne() {
    ItemWrapper * Torch = new ItemWrapper(Item("A Torch", TORCH), HIDDEN);
    ItemWrapper * Stairs = new ItemWrapper(Item("Stairs", STAIRS), HIDDEN);
    items[TORCH] = Torch;
    items[STAIRS] = Stairs;
}